

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FieldTypes.h
# Opt level: O0

void __thiscall
FIX::DateTime::getHMS(DateTime *this,int *hour,int *minute,int *second,int *fraction,int precision)

{
  int iVar1;
  int ticks;
  int precision_local;
  int *fraction_local;
  int *second_local;
  int *minute_local;
  int *hour_local;
  DateTime *this_local;
  
  iVar1 = (int)(this->m_time / 1000000000);
  *hour = iVar1 / 0xe10;
  *minute = (int)(((long)iVar1 / 0x3c) % 0x3c);
  *second = iVar1 % 0x3c;
  iVar1 = getFraction(this,precision);
  *fraction = iVar1;
  return;
}

Assistant:

inline void getHMS( int& hour, int& minute, int& second, int& fraction, int precision ) const
  {
    int ticks = (int)(m_time / NANOS_PER_SEC);
    hour = ticks / SECONDS_PER_HOUR;
    minute = (ticks / SECONDS_PER_MIN) % MINUTES_PER_HOUR;
    second = ticks % SECONDS_PER_MIN;
    fraction = getFraction(precision);
  }